

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O3

void reoProfileWidthStart2(reo_man *p)

{
  short sVar1;
  reo_unit **pprVar2;
  reo_plane *prVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  reo_plane *prVar6;
  ulong uVar7;
  reo_unit *prVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  auVar4 = _DAT_0093d220;
  uVar5 = p->nSupp;
  if (-1 < (int)uVar5) {
    prVar6 = p->pPlanes;
    auVar13._4_4_ = 0;
    auVar13._0_4_ = uVar5;
    auVar13._8_4_ = uVar5;
    auVar13._12_4_ = 0;
    lVar9 = 0;
    auVar13 = auVar13 ^ _DAT_0093d220;
    auVar14 = _DAT_0093e4e0;
    auVar15 = _DAT_0093d210;
    do {
      auVar16 = auVar15 ^ auVar4;
      iVar11 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar11 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar11 < auVar16._4_4_) & 1)) {
        *(undefined4 *)((long)&prVar6->statsWidth + lVar9) = 0;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)&prVar6[1].statsWidth + lVar9) = 0;
      }
      auVar16 = auVar14 ^ auVar4;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar11 && (iVar17 != iVar11 || auVar16._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)&prVar6[2].statsWidth + lVar9) = 0;
        *(undefined4 *)((long)&prVar6[3].statsWidth + lVar9) = 0;
      }
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar12 + 4;
      lVar12 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar12 + 4;
      lVar9 = lVar9 + 0xe0;
    } while ((ulong)(uVar5 >> 2 & 0x1fffffff) * 0xe0 + 0xe0 != lVar9);
    if (-1 < (int)uVar5) {
      prVar6 = p->pPlanes;
      lVar9 = 0;
      do {
        for (prVar8 = prVar6[lVar9].pHead; prVar8 != (reo_unit *)0x0; prVar8 = prVar8->Next) {
          prVar8->TopRef = 30000;
          prVar8->Sign = 0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != (ulong)uVar5 + 1);
    }
  }
  iVar11 = p->nTops;
  if (0 < (long)iVar11) {
    pprVar2 = p->pTops;
    lVar9 = 0;
    do {
      *(undefined2 *)(((ulong)pprVar2[lVar9] & 0xfffffffffffffffe) + 2) = 0;
      lVar9 = lVar9 + 1;
    } while (iVar11 != lVar9);
  }
  if (0 < (int)uVar5) {
    prVar6 = p->pPlanes;
    uVar7 = 0;
    do {
      prVar3 = prVar6 + uVar7;
      uVar7 = uVar7 + 1;
      for (prVar8 = prVar3->pHead; prVar8 != (reo_unit *)0x0; prVar8 = prVar8->Next) {
        if ((long)uVar7 < (long)prVar8->pE->TopRef) {
          prVar8->pE->TopRef = (short)uVar7;
        }
        if ((long)uVar7 < (long)prVar8->pT->TopRef) {
          prVar8->pT->TopRef = (short)uVar7;
        }
      }
    } while (uVar7 != uVar5);
    if (0 < (int)uVar5) {
      lVar12 = 0;
      lVar9 = 0;
      do {
        reoProfileWidthVerifyLevel((reo_plane *)((long)&p->pPlanes->fSifted + lVar12),(int)lVar9);
        lVar9 = lVar9 + 1;
        uVar5 = p->nSupp;
        lVar12 = lVar12 + 0x38;
      } while (lVar9 < (int)uVar5);
      if (0 < (int)uVar5) {
        prVar6 = p->pPlanes;
        lVar9 = 0;
        do {
          for (prVar8 = prVar6[lVar9].pHead; prVar8 != (reo_unit *)0x0; prVar8 = prVar8->Next) {
            sVar1 = prVar8->TopRef;
            if (sVar1 <= prVar8->lev) {
              lVar12 = ((long)prVar8->lev - (long)sVar1) + 1;
              piVar10 = &prVar6[sVar1].statsWidth;
              do {
                *piVar10 = *piVar10 + 1;
                piVar10 = piVar10 + 0xe;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != (int)uVar5);
        goto LAB_0081d84a;
      }
    }
  }
  prVar6 = p->pPlanes;
LAB_0081d84a:
  prVar8 = prVar6[(int)uVar5].pHead;
  if (prVar8 != (reo_unit *)0x0) {
    do {
      iVar11 = (int)prVar8->TopRef;
      if (iVar11 <= (int)uVar5) {
        piVar10 = &prVar6[iVar11].statsWidth;
        iVar11 = (uVar5 + 1) - iVar11;
        do {
          *piVar10 = *piVar10 + 1;
          piVar10 = piVar10 + 0xe;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      prVar8 = prVar8->Next;
    } while (prVar8 != (reo_unit *)0x0);
  }
  p->nWidthCur = 0;
  if ((int)uVar5 < 0) {
    iVar11 = 0;
  }
  else {
    lVar9 = 0;
    iVar11 = 0;
    do {
      iVar17 = *(int *)((long)&prVar6->statsWidth + lVar9);
      *(double *)((long)&prVar6->statsCost + lVar9) = (double)iVar17;
      iVar11 = iVar11 + iVar17;
      lVar9 = lVar9 + 0x38;
    } while ((ulong)(uVar5 + 1) * 0x38 - lVar9 != 0);
    p->nWidthCur = iVar11;
  }
  p->nWidthBeg = iVar11;
  return;
}

Assistant:

void reoProfileWidthStart2( reo_man * p )
{
    reo_unit * pUnit;
    int i, v;

    // clean the profile
    for ( i = 0; i <= p->nSupp; i++ )
        p->pPlanes[i].statsWidth = 0;
    
    // clean the node structures
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // set the topref to the topmost nodes
    for ( i = 0; i < p->nTops; i++ )
        Unit_Regular(p->pTops[i])->TopRef = 0;

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
        {
            if ( pUnit->pE->TopRef > i+1 )
                 pUnit->pE->TopRef = i+1;
            if ( pUnit->pT->TopRef > i+1 )
                 pUnit->pT->TopRef = i+1;
        }

    // verify the top reference
    for ( i = 0; i < p->nSupp; i++ )
        reoProfileWidthVerifyLevel( p->pPlanes + i, i );

    // compute the profile for the internal nodes
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
            for ( v = pUnit->TopRef; v <= pUnit->lev; v++ )
                p->pPlanes[v].statsWidth++;

    // compute the profile for the constant nodes
    for ( pUnit = p->pPlanes[p->nSupp].pHead; pUnit; pUnit = pUnit->Next )
        for ( v = pUnit->TopRef; v <= p->nSupp; v++ )
            p->pPlanes[v].statsWidth++;

    // get the width cost
    p->nWidthCur = 0;
    for ( i = 0; i <= p->nSupp; i++ )
    {
        p->pPlanes[i].statsCost = p->pPlanes[i].statsWidth;
        p->nWidthCur           += p->pPlanes[i].statsWidth;
    }
    p->nWidthBeg = p->nWidthCur;
}